

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
readFile(vector<char,_std::allocator<char>_> *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *this;
  size_type __n;
  char *pcVar3;
  fpos<__mbstate_t> local_260;
  allocator_type local_24a;
  undefined1 local_249;
  fpos local_248 [16];
  size_type local_238;
  size_t file_size;
  char local_220 [8];
  ifstream file;
  string *filename_local;
  vector<char,_std::allocator<char>_> *buffer;
  
  _Var2 = std::operator|(_S_ate,_S_bin);
  std::ifstream::ifstream(local_220,(string *)filename,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    local_248 = (fpos  [16])std::istream::tellg();
    __n = std::fpos::operator_cast_to_long(local_248);
    local_249 = 0;
    local_238 = __n;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,__n,&local_24a);
    std::allocator<char>::~allocator(&local_24a);
    std::fpos<__mbstate_t>::fpos(&local_260,0);
    std::istream::seekg(local_220,local_260._M_off,local_260._M_state);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data(__return_storage_ptr__);
    std::istream::read(local_220,(long)pcVar3);
    std::ifstream::close();
    local_249 = 1;
    std::ifstream::~ifstream(local_220);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"failed to open file!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<char> readFile(const std::string& filename) {
    std::ifstream file(filename, std::ios::ate | std::ios::binary);

    if (!file.is_open()) {
        throw std::runtime_error("failed to open file!");
    }

    size_t file_size = (size_t)file.tellg();
    std::vector<char> buffer(file_size);

    file.seekg(0);
    file.read(buffer.data(), static_cast<std::streamsize>(file_size));
    file.close();

    return buffer;
}